

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  longlong *plVar5;
  longlong *plVar6;
  longlong *plVar7;
  size_t __n;
  pointer puVar8;
  ushort *puVar9;
  undefined2 uVar10;
  ushort uVar11;
  int i;
  int iVar12;
  int iVar13;
  byte *pbVar14;
  long *plVar15;
  mz_ulong __n_00;
  byte *pbVar16;
  ushort *puVar17;
  byte *pbVar18;
  ushort *puVar19;
  longlong **pplVar20;
  void *pvVar21;
  void *__s;
  longlong *hcode;
  uint uVar22;
  long lVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  ushort *puVar28;
  int *piVar29;
  value_type_conflict6 *__val;
  pointer pPVar30;
  longlong **pplVar31;
  short bs;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ushort *puVar35;
  int iVar36;
  int *piVar37;
  ushort uVar38;
  ulong uVar39;
  byte *pbVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  byte bVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  value_type_conflict5 *__val_2;
  pointer __n_01;
  pointer pPVar50;
  value_type_conflict3 *__val_4;
  ulong uVar51;
  uint uVar52;
  value_type_conflict3 *__val_1;
  ulong uVar53;
  unsigned_short *puVar54;
  int i_1;
  long lVar55;
  ushort *puVar56;
  bool bVar57;
  undefined4 in_stack_00000014;
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  undefined4 in_stack_0000001c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  allocator_type local_191;
  byte *local_190;
  longlong **local_188;
  byte *local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  ushort *local_160;
  long *local_158;
  ulong local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  void *local_130;
  ushort *local_128;
  longlong **local_120;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_118;
  byte *local_100;
  ushort *local_f8;
  long local_f0;
  ulong local_e8;
  long local_e0;
  uint local_d8;
  int local_d4;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_d0;
  long local_c8;
  ulong local_c0;
  byte *local_b8;
  long local_b0;
  uint local_a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  void *local_88;
  pointer local_80;
  pointer local_78;
  longlong **local_70;
  ushort *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_180 = (byte *)CONCAT44(local_180._4_4_,param_6);
  local_128 = (ushort *)CONCAT44(local_128._4_4_,compression_type);
  local_188 = (longlong **)(long)x_stride;
  pbVar16 = (byte *)CONCAT44(in_stack_0000001c,num_lines);
  lVar55 = (long)param_4;
  local_d0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_148,(long)local_188 * lVar55 * CONCAT44(in_stack_00000014,line_no),
             (allocator_type *)&local_178);
  lVar24 = *(long *)pbVar16;
  if (*(long *)(pbVar16 + 8) != lVar24) {
    lVar23 = (long)(int)local_180;
    lVar27 = (long)width;
    uVar53 = (ulong)local_188 & 0xffffffff;
    uVar33 = (ulong)(uint)param_4;
    local_190 = (byte *)(lVar23 * lVar27 * 4);
    local_180 = (byte *)(lVar27 * 4);
    local_158 = (long *)(lVar23 * lVar27 * 2);
    local_f8 = (ushort *)(lVar27 * 2);
    uVar51 = 0;
    local_120 = (longlong **)CONCAT44(local_120._4_4_,param_4);
    do {
      lVar27 = CONCAT44(in_stack_00000014,line_no);
      lVar23 = lVar24 + uVar51 * 0x38;
      iVar12 = *(int *)(lVar24 + 0x20 + uVar51 * 0x38);
      if (iVar12 == 2) {
        iVar12 = *(int *)(lVar23 + 0x24);
        if (iVar12 == 1) {
          if (0 < (int)local_188) {
            lVar24 = 0;
            uVar39 = 0;
            pbVar14 = local_190;
            do {
              lVar23 = *(long *)(*(long *)pixel_data_size + uVar51 * 8);
              pbVar18 = (byte *)CONCAT44(local_148.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_148.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pbVar18)
                  <= (uVar39 * CONCAT44(in_stack_00000014,line_no) + lVar23) * lVar55)
              goto LAB_00230247;
              pbVar16 = pbVar18;
              if (0 < param_4) {
                lVar23 = (lVar23 + lVar24) * lVar55;
                uVar34 = 0;
                do {
                  uVar46 = *(uint *)(images[uVar51] + (long)pbVar14 + uVar34 * 4);
                  uVar26 = uVar46 >> 0x17;
                  uVar22 = uVar26 & 0xff;
                  if ((char)uVar26 != '\0') {
                    if (uVar22 == 0xff) {
                      uVar22 = ((uVar46 & 0x7fffff) != 0 | 0x3e) << 9;
                    }
                    else {
                      uVar52 = 0x7c00;
                      if (uVar22 < 0x8f) {
                        if (uVar22 < 0x71) {
                          uVar52 = 0;
                          if (uVar22 < 0x66) goto LAB_0022ea7e;
                          uVar41 = uVar46 & 0x7fffff | 0x800000;
                          uVar52 = uVar41 >> (0x7eU - (char)uVar26 & 0x1f) & 0x3ff;
                          uVar41 = uVar41 >> (0x7d - uVar22 & 0x1f);
                        }
                        else {
                          uVar52 = (uVar46 >> 0xd & 0x3ff | (uVar26 & 0x1f) << 10) ^ 0x4000;
                          uVar41 = uVar46 >> 0xc;
                        }
                        uVar52 = uVar52 + ((uVar41 & 1) != 0);
                      }
LAB_0022ea7e:
                      uVar22 = uVar52 & 0x7fff;
                    }
                  }
                  uVar46 = uVar46 >> 0x10 & 0x8000 | uVar22;
                  pbVar16 = (byte *)(ulong)uVar46;
                  pbVar18[uVar34 * 2 + lVar23] = (byte)uVar22;
                  pbVar18[uVar34 * 2 + lVar23 + 1] = (byte)(uVar46 >> 8);
                  uVar34 = uVar34 + 1;
                } while (uVar33 != uVar34);
              }
              uVar39 = uVar39 + 1;
              lVar24 = lVar24 + CONCAT44(in_stack_00000014,line_no);
              pbVar14 = pbVar14 + (long)local_180;
            } while (uVar39 != uVar53);
          }
        }
        else {
          if (iVar12 != 2) {
LAB_0022eee7:
            if (channels !=
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
              std::__cxx11::string::append((char *)channels);
            }
            goto LAB_0022f2d8;
          }
          if (0 < (int)local_188) {
            lVar24 = 0;
            uVar39 = 0;
            pbVar14 = local_190;
            do {
              lVar23 = *(long *)(*(long *)pixel_data_size + uVar51 * 8);
              pbVar16 = (byte *)CONCAT44(local_148.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_148.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pbVar16)
                  <= (uVar39 * CONCAT44(in_stack_00000014,line_no) + lVar23) * lVar55)
              goto LAB_00230239;
              if (0 < param_4) {
                uVar34 = 0;
                do {
                  *(undefined4 *)(pbVar16 + uVar34 * 4 + (lVar23 + lVar24) * lVar55) =
                       *(undefined4 *)(images[uVar51] + (long)pbVar14 + uVar34 * 4);
                  uVar34 = uVar34 + 1;
                } while (uVar33 != uVar34);
              }
              uVar39 = uVar39 + 1;
              lVar24 = lVar24 + CONCAT44(in_stack_00000014,line_no);
              pbVar14 = pbVar14 + (long)local_180;
            } while (uVar39 != uVar53);
          }
        }
      }
      else if (iVar12 == 1) {
        iVar12 = *(int *)(lVar23 + 0x24);
        if (iVar12 == 2) {
          if (0 < (int)local_188) {
            lVar24 = 0;
            uVar39 = 0;
            plVar15 = local_158;
            do {
              lVar23 = *(long *)(*(long *)pixel_data_size + uVar51 * 8);
              pbVar14 = (byte *)CONCAT44(local_148.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_148.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pbVar14)
                  <= (uVar39 * lVar27 + lVar23) * lVar55) goto LAB_00230255;
              pbVar16 = pbVar14;
              if (0 < param_4) {
                lVar23 = (lVar23 + lVar24) * lVar55;
                uVar34 = 0;
                do {
                  uVar11 = *(ushort *)(images[uVar51] + (long)plVar15 + uVar34 * 2);
                  uVar46 = (uint)uVar11 << 0xd;
                  if ((uVar46 & 0xf800000) == 0xf800000) {
                    pbVar16 = (byte *)(ulong)(uVar46 | 0x70000000);
                  }
                  else if ((uVar46 & 0xf800000) == 0) {
                    pbVar16 = (byte *)(ulong)(uint)((float)(uVar46 | 0x38800000) + -6.1035156e-05);
                  }
                  else {
                    pbVar16 = (byte *)(ulong)((uVar46 & 0xfffe000) + 0x38000000);
                  }
                  pbVar14[uVar34 * 4 + lVar23] = (byte)pbVar16;
                  pbVar14[uVar34 * 4 + lVar23 + 1] = (byte)((ulong)pbVar16 >> 8);
                  pbVar14[uVar34 * 4 + lVar23 + 2] = (byte)((ulong)pbVar16 >> 0x10);
                  pbVar14[uVar34 * 4 + lVar23 + 3] =
                       (byte)((short)uVar11 >> 0xf) & 0x80 | (byte)((ulong)pbVar16 >> 0x18);
                  uVar34 = uVar34 + 1;
                } while (uVar33 != uVar34);
              }
              uVar39 = uVar39 + 1;
              lVar24 = lVar24 + lVar27;
              plVar15 = (long *)((long)plVar15 + (long)local_f8);
            } while (uVar39 != uVar53);
          }
        }
        else {
          if (iVar12 != 1) goto LAB_0022eee7;
          if (0 < (int)local_188) {
            lVar24 = 0;
            uVar39 = 0;
            plVar15 = local_158;
            do {
              lVar23 = *(long *)(*(long *)pixel_data_size + uVar51 * 8);
              pbVar16 = (byte *)CONCAT44(local_148.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_148.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pbVar16)
                  <= (uVar39 * lVar27 + lVar23) * lVar55) goto LAB_00230263;
              if (0 < param_4) {
                uVar34 = 0;
                do {
                  *(undefined2 *)(pbVar16 + uVar34 * 2 + (lVar23 + lVar24) * lVar55) =
                       *(undefined2 *)(images[uVar51] + (long)plVar15 + uVar34 * 2);
                  uVar34 = uVar34 + 1;
                } while (uVar33 != uVar34);
              }
              uVar39 = uVar39 + 1;
              lVar24 = lVar24 + lVar27;
              plVar15 = (long *)((long)plVar15 + (long)local_f8);
            } while (uVar39 != uVar53);
          }
        }
      }
      else if ((iVar12 == 0) && (0 < (int)local_188)) {
        lVar24 = 0;
        uVar39 = 0;
        pbVar14 = local_190;
        do {
          lVar23 = *(long *)(*(long *)pixel_data_size + uVar51 * 8);
          pbVar16 = (byte *)CONCAT44(local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          if ((ulong)(CONCAT44(local_148.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)local_148.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) - (long)pbVar16) <=
              (uVar39 * CONCAT44(in_stack_00000014,line_no) + lVar23) * lVar55) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00230239:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00230247:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00230255:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00230263:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_00230271;
          }
          if (0 < param_4) {
            uVar34 = 0;
            do {
              *(undefined4 *)(pbVar16 + uVar34 * 4 + (lVar23 + lVar24) * lVar55) =
                   *(undefined4 *)(images[uVar51] + (long)pbVar14 + uVar34 * 4);
              uVar34 = uVar34 + 1;
            } while (uVar33 != uVar34);
          }
          uVar39 = uVar39 + 1;
          lVar24 = lVar24 + CONCAT44(in_stack_00000014,line_no);
          pbVar14 = pbVar14 + (long)local_180;
        } while (uVar39 != uVar53);
      }
      uVar51 = uVar51 + 1;
      lVar24 = *(long *)CONCAT44(in_stack_0000001c,num_lines);
    } while (uVar51 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - lVar24 >> 3) *
                             0x6db6db6db6db6db7));
  }
  if ((uint)local_128 == 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_d0,*(undefined8 *)(local_d0 + 8),
               CONCAT44(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),
               CONCAT44(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
LAB_00230206:
    bVar57 = true;
    goto LAB_00230208;
  }
  if (((uint)local_128 & 0xfffffffe) == 2) {
    __n_00 = mz_compressBound(CONCAT44(local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)local_148.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) -
                              CONCAT44(local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_148.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,__n_00,
               (allocator_type *)&local_178);
    pPVar50 = local_118.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar30 = (pointer)((long)local_118.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_118.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    if (pPVar30 == (pointer)0x0) {
LAB_002302b2:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                 pPVar30);
LAB_002302c5:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_002302d7:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      pvVar21 = (void *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pbVar16 = (byte *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      __n_01 = (pointer)(pbVar16 + -(long)pvVar21);
      if (__n_01 == (pointer)0x0) {
        pPVar30 = (pointer)0x0;
        goto LAB_002302b2;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_178,(size_type)__n_01,(allocator_type *)&local_a0);
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_002302c5;
      if (0 < (long)__n_01) {
        lVar24 = 0;
        do {
          pbVar14 = (byte *)(lVar24 * 2 + 1 + (long)pvVar21);
          *(byte *)((long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar24) = pbVar14[-1];
          if (pbVar16 <= pbVar14) break;
          *(byte *)((long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   lVar24 + ((ulong)((long)&__n_01->start + 1U) >> 1)) = *pbVar14;
          lVar24 = lVar24 + 1;
        } while (pbVar14 + 1 < pbVar16);
      }
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_002302d7;
      if (1 < (long)__n_01) {
        pbVar16 = (byte *)((long)local_178.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        bVar25 = *local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar45 = *pbVar16;
          *pbVar16 = (bVar45 - bVar25) + 0x80;
          pbVar16 = pbVar16 + 1;
          bVar25 = bVar45;
        } while (pbVar16 < (byte *)((long)local_178.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + (long)__n_01))
        ;
      }
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)mz_compressBound((mz_ulong)__n_01);
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar12 = mz_compress((uchar *)pPVar50,(mz_ulong *)&local_a0,
                             local_178.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(mz_ulong)__n_01);
        if ((iVar12 == 0) &&
           (pPVar30 = (pointer)local_a0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
           __n_01 <= local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)) {
          memcpy(pPVar50,pvVar21,(size_t)__n_01);
          pPVar30 = __n_01;
        }
        if ((ushort *)
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (iVar12 == 0) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_d0,*(undefined8 *)(local_d0 + 8),
                     local_118.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (byte *)((long)&(local_118.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start +
                             ((ulong)pPVar30 & 0xffffffff)));
        }
        else if (channels !=
                 (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
          std::__cxx11::string::append((char *)channels);
        }
        if (local_118.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar12 != 0) goto LAB_0022f2d8;
        goto LAB_00230206;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_002302fb:
    pbVar16 = (byte *)0x0;
LAB_002302fd:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pbVar16
              );
LAB_00230310:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00230322:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00230334:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00230346:
    local_150 = 0;
LAB_0023034f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               local_150);
LAB_00230364:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00230376:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pbVar16
              );
  }
  else {
    if ((uint)local_128 == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
LAB_0022f2d8:
      bVar57 = false;
LAB_00230208:
      if ((void *)CONCAT44(local_148.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_148.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_148.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      return bVar57;
    }
    if ((uint)local_128 != 4) {
      if ((uint)local_128 != 1) goto LAB_0022f2d8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,
                 (ulong)((CONCAT44(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_148.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_148.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_148.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) * 3) >> 1,
                 (allocator_type *)&local_178);
      pPVar30 = local_118.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_118.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_118.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start) goto LAB_002302fb;
      pbVar14 = (byte *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pbVar18 = (byte *)CONCAT44(local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      pbVar16 = pbVar18 + -(long)pbVar14;
      if (pbVar16 == (byte *)0x0) goto LAB_002302fd;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_178,(size_type)pbVar16,(allocator_type *)&local_a0);
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00230310;
      if (0 < (long)pbVar16) {
        puVar17 = (ushort *)
                  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pbVar40 = pbVar14;
        do {
          *(byte *)puVar17 = *pbVar40;
          if (pbVar18 <= pbVar40 + 1) break;
          *(byte *)((long)puVar17 + ((ulong)(pbVar16 + 1) >> 1)) = pbVar40[1];
          puVar17 = (ushort *)((long)puVar17 + 1);
          pbVar40 = pbVar40 + 2;
        } while (pbVar40 < pbVar18);
      }
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_00230322;
      if (1 < (long)pbVar16) {
        pbVar18 = (byte *)((long)local_178.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        bVar25 = *local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar45 = *pbVar18;
          *pbVar18 = (bVar45 - bVar25) + 0x80;
          pbVar18 = pbVar18 + 1;
          bVar25 = bVar45;
        } while (pbVar18 < (byte *)((long)local_178.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + (long)pbVar16)
                );
      }
      local_180 = pbVar14;
      if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar50 = pPVar30;
        if (0 < (int)pbVar16) {
          puVar19 = (ushort *)
                    ((long)(int)pbVar16 +
                    (long)local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
          puVar17 = (ushort *)
                    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar56 = (ushort *)
                    local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_0022ede7:
          lVar24 = ((long)puVar17 + 1) - (long)puVar56;
          puVar35 = (ushort *)((long)puVar17 + 3);
          puVar9 = (ushort *)((long)puVar17 + 1);
          pbVar18 = (byte *)(~(ulong)puVar17 + (long)puVar56);
          bVar25 = (char)puVar17 - (char)puVar56;
          do {
            bVar45 = bVar25;
            pbVar40 = pbVar18;
            puVar17 = puVar9;
            puVar28 = puVar35;
            lVar55 = lVar24;
            if ((puVar19 <= puVar17) || ((long)pbVar40 < -0x7f)) break;
            lVar24 = lVar55 + 1;
            puVar35 = (ushort *)((long)puVar28 + 1);
            puVar9 = (ushort *)((long)puVar17 + 1);
            pbVar18 = pbVar40 + -1;
            bVar25 = bVar45 + 1;
          } while ((byte)*puVar56 == (byte)*puVar17);
          if (pbVar40 == (byte *)0xfffffffffffffffe || -(long)pbVar40 < 2) {
            if (puVar17 < puVar19) {
              do {
                if ((((ushort *)((long)puVar28 - 1U) < puVar19) &&
                    ((byte)puVar28[-1] == *(byte *)((long)puVar28 + -1))) && (puVar28 < puVar19)) {
                  if ((0x7e < lVar55) || (*(byte *)((long)puVar28 + -1) == (byte)*puVar28))
                  goto LAB_0022eee1;
                }
                else if ((puVar19 <= (ushort *)((long)puVar28 - 1U)) || (0x7e < lVar55)) {
                  puVar17 = (ushort *)((long)puVar28 + ~(ulong)(0x7e < lVar55));
                  break;
                }
                puVar28 = (ushort *)((long)puVar28 + 1);
                lVar55 = lVar55 + 1;
              } while( true );
            }
            goto LAB_0022eeaa;
          }
          *(byte *)&pPVar50->start = bVar45;
          *(byte *)((long)&pPVar50->start + 1) = (byte)*puVar56;
          pPVar50 = (pointer)((long)&pPVar50->start + 2);
          puVar56 = puVar17;
          goto LAB_0022eed3;
        }
LAB_0022f2df:
        uVar46 = (int)pPVar50 - (int)pPVar30;
        if ((int)uVar46 < 1) goto LAB_00230399;
        pbVar18 = (byte *)(ulong)(uVar46 & 0x7fffffff);
        if (pbVar16 <= pbVar18) {
          memcpy(pPVar30,pbVar14,(size_t)pbVar16);
          pbVar18 = (byte *)((ulong)pbVar16 & 0xffffffff);
        }
        if ((ushort *)
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_178.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (local_d0,*(undefined8 *)(local_d0 + 8),
                   local_118.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   pbVar18 + (long)local_118.
                                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_002301fc;
      }
      goto LAB_00230334;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a0,
               (ulong)(((int)local_148.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
               (allocator_type *)&local_178);
    puVar8 = local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00230346;
    local_88 = (void *)CONCAT44(local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_148.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    uVar53 = CONCAT44(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_148.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) - (long)local_88;
    local_150 = uVar53;
    if (uVar53 == 0) goto LAB_0023034f;
    pbVar16 = (byte *)operator_new(0x2000);
    memset(pbVar16,0,0x2000);
    local_100 = pbVar16;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_178,uVar53 >> 1,
               (allocator_type *)&local_118);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&local_118,
               (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                *(long *)CONCAT44(in_stack_0000001c,num_lines) >> 3) * 0x6db6db6db6db6db7,&local_191
              );
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00230364;
    local_80 = (pointer)puVar8;
    iVar12 = (int)local_188;
    if ((long)local_118.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_118.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar24 = (long)local_118.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar24 = lVar24 + (ulong)(lVar24 == 0);
      piVar37 = (int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + 0x24);
      piVar29 = &(local_118.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size;
      puVar17 = (ushort *)
                local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        ((PIZChannelData *)(piVar29 + -7))->start = puVar17;
        *(ushort **)(piVar29 + -5) = puVar17;
        piVar29[-3] = param_4;
        piVar29[-2] = iVar12;
        iVar13 = *piVar37;
        *piVar29 = (iVar13 != 1) + 1;
        puVar17 = puVar17 + (iVar12 * param_4 << (iVar13 != 1));
        piVar37 = piVar37 + 0xe;
        piVar29 = piVar29 + 8;
        lVar24 = lVar24 + -1;
      } while (lVar24 != 0);
    }
    if (0 < iVar12) {
      iVar12 = 0;
      pvVar21 = local_88;
      do {
        if (local_118.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_118.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar24 = 8;
          uVar53 = 0;
          do {
            pPVar30 = local_118.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar55 = (long)*(int *)((long)&(local_118.
                                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ny + lVar24)
                     * (long)*(int *)((long)&(local_118.
                                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->end +
                                     lVar24);
            __n = lVar55 * 2;
            memcpy(*(void **)((long)&(local_118.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start + lVar24),
                   pvVar21,__n);
            pbVar16 = (byte *)((long)&pPVar30->start + lVar24);
            *(size_t *)pbVar16 = *(long *)pbVar16 + __n;
            pvVar21 = (void *)((long)pvVar21 + lVar55 * 2);
            uVar53 = uVar53 + 1;
            lVar24 = lVar24 + 0x20;
          } while (uVar53 < (ulong)((long)local_118.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_118.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != (int)local_188);
    }
    pbVar14 = local_100;
    puVar8 = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar16 = (byte *)((long)local_178.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_178.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 1);
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00230376;
    memset(local_100,0,0x2000);
    if (0 < (int)(uint)pbVar16) {
      uVar53 = 0;
      do {
        pbVar14[*(ushort *)((long)puVar8 + uVar53 * 2) >> 3] =
             pbVar14[*(ushort *)((long)puVar8 + uVar53 * 2) >> 3] |
             (byte)(1 << ((byte)*(ushort *)((long)puVar8 + uVar53 * 2) & 7));
        uVar53 = uVar53 + 1;
      } while (((uint)pbVar16 & 0x7fffffff) != uVar53);
    }
    *pbVar14 = *pbVar14 & 0xfe;
    uVar51 = 0x1fff;
    uVar33 = 0;
    uVar53 = 0;
    do {
      if (local_100[uVar53] != 0) {
        uVar51 = uVar51 & 0xffff;
        if (uVar53 < uVar51) {
          uVar51 = uVar53 & 0xffffffff;
        }
        uVar33 = uVar33 & 0xffff;
        if (uVar33 < uVar53) {
          uVar33 = uVar53 & 0xffffffff;
        }
      }
      uVar53 = uVar53 + 1;
    } while (uVar53 != 0x2000);
    local_130 = operator_new(0x20000);
    uVar39 = 0;
    memset(local_130,0,0x20000);
    uVar53 = local_150;
    local_e8 = 0;
    do {
      if ((uVar39 == 0) || ((local_100[uVar39 >> 3 & 0x1fffffff] >> ((uint)uVar39 & 7) & 1) != 0)) {
        uVar10 = (undefined2)local_e8;
        local_e8 = (ulong)((int)local_e8 + 1);
      }
      else {
        uVar10 = 0;
      }
      *(undefined2 *)((long)local_130 + uVar39 * 2) = uVar10;
      uVar39 = uVar39 + 1;
    } while (uVar39 != 0x10000);
    local_f0 = (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1;
    local_160 = (ushort *)
                local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (0 < (int)(uint)local_f0) {
        uVar39 = 0;
        do {
          *(ushort *)
           ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar39 * 2) =
               *(ushort *)
                ((long)local_130 +
                (ulong)*(ushort *)
                        ((long)local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar39 * 2) * 2);
          uVar39 = uVar39 + 1;
        } while (((uint)local_f0 & 0x7fffffff) != uVar39);
      }
      *(ushort *)&local_80->start = (ushort)uVar51;
      *(ushort *)((long)&local_80->start + 2) = (ushort)uVar33;
      pbVar16 = (byte *)((long)&local_80->start + 4);
      if ((ushort)uVar51 <= (ushort)uVar33) {
        lVar24 = (uVar33 & 0xffff) - (uVar51 & 0xffff);
        memcpy(pbVar16,local_100 + (uVar51 & 0xffff),lVar24 + 1);
        pbVar16 = pbVar16 + lVar24 + 1;
      }
      local_78 = local_118.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_118.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_118.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar46 = (int)local_e8 - 1;
        local_e8 = (ulong)uVar46;
        local_50 = (long)local_118.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_118.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_50 = local_50 + (ulong)(local_50 == 0);
        lVar24 = 0;
        do {
          local_48 = lVar24;
          iVar12 = local_118.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_48].size;
          local_e0 = (long)iVar12;
          if (0 < local_e0) {
            pPVar30 = local_118.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_48;
            puVar4 = pPVar30->start;
            uVar26 = pPVar30->nx;
            local_a4 = pPVar30->ny;
            local_d4 = uVar26 * iVar12;
            local_158 = (long *)CONCAT44(local_158._4_4_,uVar26);
            local_d8 = local_a4;
            if ((int)uVar26 < (int)local_a4) {
              local_d8 = uVar26;
            }
            local_70 = (longlong **)0x0;
            local_b0 = 0;
            do {
              if (1 < (int)local_d8) {
                local_68 = puVar4 + local_b0;
                uVar33 = 2;
                uVar22 = 1;
                do {
                  local_58 = uVar33;
                  uVar52 = (uint)local_58;
                  iVar13 = (local_a4 - uVar52) * local_d4;
                  local_190 = (byte *)CONCAT44(local_190._4_4_,uVar22);
                  local_60 = (long)(int)(uVar22 * iVar12);
                  lVar24 = (long)(int)(uVar52 * iVar12);
                  uVar41 = uVar46 & 0xffff;
                  puVar17 = local_68;
                  if (-1 < iVar13) {
                    local_128 = local_68 + iVar13;
                    iVar13 = (uVar26 - uVar52) * iVar12;
                    local_40 = (long)iVar13;
                    local_120 = (longlong **)(long)(int)(uVar22 * local_d4);
                    local_c0 = (ulong)(int)(uVar52 * local_d4);
                    local_38 = local_c0 * 2;
                    puVar2 = puVar4 + (long)local_120;
                    puVar54 = puVar4 + (long)local_120 + local_60;
                    puVar3 = puVar4 + local_60;
                    pplVar31 = local_70;
                    do {
                      puVar56 = puVar17;
                      if (-1 < iVar13) {
                        pplVar20 = pplVar31;
                        do {
                          uVar47 = (uint)*(short *)((long)puVar4 + (long)pplVar20);
                          uVar11 = *(ushort *)((long)puVar3 + (long)pplVar20);
                          if (uVar41 < 0x4000) {
                            iVar42 = uVar47 - (int)(short)uVar11;
                            iVar36 = (int)*(short *)((long)puVar2 + (long)pplVar20) -
                                     (int)*(short *)((long)puVar54 + (long)pplVar20);
                            uVar47 = (int)(short)uVar11 + uVar47;
                            uVar32 = (int)*(short *)((long)puVar54 + (long)pplVar20) +
                                     (int)*(short *)((long)puVar2 + (long)pplVar20);
                            *(short *)((long)puVar4 + (long)pplVar20) =
                                 (short)((uint)(((int)uVar47 >> 1) + ((int)uVar32 >> 1)) >> 1);
                            *(short *)((long)puVar2 + (long)pplVar20) =
                                 (short)(uVar47 >> 1) - (short)(uVar32 >> 1);
                            iVar43 = iVar42 - iVar36;
                            *(short *)((long)puVar3 + (long)pplVar20) =
                                 (short)((uint)((int)(short)iVar42 + (int)(short)iVar36) >> 1);
                          }
                          else {
                            uVar48 = (uVar47 ^ 0x8000) & 0xffff;
                            uVar49 = uVar48 - uVar11;
                            uVar47 = *(ushort *)((long)puVar2 + (long)pplVar20) ^ 0x8000;
                            uVar44 = uVar47 - *(ushort *)((long)puVar54 + (long)pplVar20);
                            uVar32 = uVar44 >> 0x10 & 0x8000 ^
                                     uVar47 + *(ushort *)((long)puVar54 + (long)pplVar20) >> 1;
                            uVar47 = uVar48 + uVar11 >> 1 ^ 0x8000 ^ uVar49 >> 0x10 & 0x8000;
                            iVar43 = uVar47 - uVar32;
                            *(ushort *)((long)puVar4 + (long)pplVar20) =
                                 (ushort)((uint)iVar43 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar32 + uVar47 >> 1);
                            *(short *)((long)puVar2 + (long)pplVar20) = (short)iVar43;
                            uVar47 = uVar49 & 0xffff ^ 0x8000;
                            uVar44 = uVar44 & 0xffff;
                            iVar43 = uVar47 - uVar44;
                            *(ushort *)((long)puVar3 + (long)pplVar20) =
                                 (ushort)((uint)iVar43 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar44 + uVar47 >> 1);
                          }
                          *(short *)((long)puVar54 + (long)pplVar20) = (short)iVar43;
                          pplVar20 = (longlong **)((long)pplVar20 + lVar24 * 2);
                          puVar56 = (ushort *)((long)puVar4 + (long)pplVar20);
                          local_188 = pplVar31;
                          local_f8 = puVar17;
                        } while (puVar56 <= puVar17 + local_40);
                      }
                      if ((uVar26 & uVar22) != 0) {
                        uVar47 = (uint)(short)*puVar56;
                        uVar11 = puVar56[(long)local_120];
                        if (uVar41 < 0x4000) {
                          uVar38 = (ushort)((int)(short)uVar11 + uVar47 >> 1);
                          iVar43 = uVar47 - (int)(short)uVar11;
                        }
                        else {
                          uVar47 = (uVar47 ^ 0x8000) & 0xffff;
                          iVar43 = uVar47 - uVar11;
                          uVar38 = (ushort)((uint)iVar43 >> 0x10) & 0x8000 ^
                                   (ushort)(uVar47 + uVar11 >> 1);
                        }
                        puVar56[(long)local_120] = (ushort)iVar43;
                        *puVar56 = uVar38;
                      }
                      puVar17 = puVar17 + local_c0;
                      pplVar31 = (longlong **)((long)pplVar31 + local_38);
                    } while (puVar17 <= local_128);
                  }
                  local_c8 = lVar24;
                  if (((uVar22 & local_a4) != 0) &&
                     (iVar13 = (uVar26 - uVar52) * iVar12, -1 < iVar13)) {
                    puVar56 = puVar17 + iVar13;
                    local_c8 = lVar24 * 2;
                    do {
                      uVar22 = (uint)(short)*puVar17;
                      uVar11 = puVar17[local_60];
                      if (uVar41 < 0x4000) {
                        uVar38 = (ushort)((int)(short)uVar11 + uVar22 >> 1);
                        iVar13 = uVar22 - (int)(short)uVar11;
                      }
                      else {
                        uVar22 = (uVar22 ^ 0x8000) & 0xffff;
                        iVar13 = uVar22 - uVar11;
                        uVar38 = (ushort)((uint)iVar13 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar22 + uVar11 >> 1);
                      }
                      puVar17[local_60] = (ushort)iVar13;
                      *puVar17 = uVar38;
                      puVar17 = puVar17 + lVar24;
                    } while (puVar17 <= puVar56);
                  }
                  uVar33 = (ulong)(uVar52 * 2);
                  uVar53 = local_150;
                  uVar22 = uVar52;
                } while ((int)(uVar52 * 2) <= (int)local_d8);
              }
              local_b0 = local_b0 + 1;
              local_70 = (longlong **)((long)local_70 + 2);
            } while (local_b0 != local_e0);
          }
          lVar24 = local_48 + 1;
        } while (local_48 + 1 != local_50);
      }
      pbVar16[0] = 0;
      pbVar16[1] = 0;
      pbVar16[2] = 0;
      pbVar16[3] = 0;
      local_b8 = pbVar16 + 4;
      local_180 = pbVar16;
      if ((int)local_f0 == 0) {
        iVar13 = 0;
        iVar12 = (int)local_b8;
      }
      else {
        pvVar21 = operator_new(0x80008);
        memset(pvVar21,0,0x80008);
        if (0 < (int)(uint)local_f0) {
          uVar53 = 0;
          do {
            plVar15 = (long *)((long)pvVar21 + (ulong)local_160[uVar53] * 8);
            *plVar15 = *plVar15 + 1;
            uVar53 = uVar53 + 1;
          } while (((uint)local_f0 & 0x7fffffff) != uVar53);
        }
        __s = operator_new(0x40004);
        memset(__s,0,0x40004);
        pplVar31 = (longlong **)operator_new(0x80008);
        memset(pplVar31,0,0x80008);
        plVar15 = (long *)((long)pvVar21 + -8);
        local_c0 = 0xffffffffffffffff;
        do {
          local_c0 = local_c0 + 1;
          plVar1 = plVar15 + 1;
          plVar15 = plVar15 + 1;
        } while (*plVar1 == 0);
        uVar53 = (ulong)local_190 >> 0x20;
        local_190 = (byte *)(uVar53 << 0x20);
        iVar12 = 0;
        if (local_c0 < 0x10001) {
          local_190 = (byte *)(uVar53 << 0x20);
          iVar12 = 0;
          uVar53 = local_c0;
          do {
            *(int *)((long)__s + uVar53 * 4) = (int)uVar53;
            if (*plVar15 != 0) {
              pplVar31[iVar12] = plVar15;
              iVar12 = iVar12 + 1;
              local_190 = (byte *)CONCAT44(local_190._4_4_,(int)uVar53);
            }
            uVar53 = uVar53 + 1;
            plVar15 = plVar15 + 1;
          } while (uVar53 != 0x10001);
        }
        local_128 = (ushort *)(long)(int)local_190;
        local_158 = (long *)((long)pvVar21 + (long)local_128 * 8 + 8);
        *(undefined8 *)((long)pvVar21 + (long)local_128 * 8 + 8) = 1;
        pplVar31[iVar12] = local_158;
        std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (pplVar31,pplVar31 + (long)iVar12 + 1,
                   (_Iter_comp_iter<tinyexr::FHeapCompare> *)&local_191);
        hcode = (longlong *)operator_new(0x80008);
        memset(hcode,0,0x80008);
        if (0 < iVar12) {
          local_120 = pplVar31 + -1;
          puVar17 = (ushort *)(ulong)(iVar12 + 1);
          do {
            plVar5 = *pplVar31;
            plVar6 = pplVar31[(long)puVar17 + -1];
            pplVar31[(long)puVar17 + -1] = plVar5;
            std::
            __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                      (pplVar31,0,(long)local_120 + ((long)puVar17 * 8 - (long)pplVar31) >> 3,plVar6
                      );
            puVar56 = (ushort *)((long)puVar17 - 1);
            plVar6 = *pplVar31;
            pplVar20 = pplVar31 + (long)puVar17 + -1;
            if ((ushort *)0x1 < puVar56) {
              plVar7 = pplVar31[(long)(puVar17 + -1)];
              pplVar31[(long)(puVar17 + -1)] = plVar6;
              local_188 = pplVar31 + (long)puVar17 + -1;
              local_f8 = puVar56;
              std::
              __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                        (pplVar31,0,(long)puVar17 * 8 + -0x10 >> 3,plVar7);
              pplVar20 = local_188;
              puVar56 = local_f8;
            }
            uVar53 = (ulong)((long)plVar5 - (long)pvVar21) >> 3;
            uVar33 = (ulong)((long)plVar6 - (long)pvVar21) >> 3;
            iVar12 = (int)uVar53;
            lVar24 = (long)iVar12;
            plVar15 = (long *)((long)pvVar21 + (long)(int)uVar33 * 8);
            *plVar15 = *plVar15 + *(long *)((long)pvVar21 + lVar24 * 8);
            plVar15 = pplVar20[-1];
            puVar19 = puVar17 + -1;
            if ((ushort *)0x1 < puVar56) {
              lVar55 = *plVar15;
              do {
                puVar35 = (ushort *)((long)puVar19 + (-1 - ((long)puVar19 + -1 >> 0x3f)) >> 1);
                if (*pplVar31[(long)puVar35] <= lVar55) break;
                pplVar31[(long)puVar19] = pplVar31[(long)puVar35];
                bVar57 = 2 < (long)puVar19;
                puVar19 = puVar35;
              } while (bVar57);
            }
            pplVar31[(long)puVar19] = plVar15;
            do {
              uVar46 = (uint)uVar33;
              lVar23 = (long)(int)uVar46;
              lVar55 = hcode[lVar23];
              hcode[lVar23] = lVar55 + 1;
              if (0x39 < lVar55) {
LAB_00230271:
                __assert_fail("scode[j] <= 58",
                              "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                              ,0x8f5,"void tinyexr::hufBuildEncTable(long long *, int *, int *)");
              }
              uVar26 = *(uint *)((long)__s + lVar23 * 4);
              uVar33 = (ulong)uVar26;
            } while (uVar26 != uVar46);
            *(int *)((long)__s + lVar23 * 4) = iVar12;
            lVar55 = hcode[lVar24];
            hcode[lVar24] = lVar55 + 1;
            while( true ) {
              if (0x39 < lVar55) {
                __assert_fail("scode[j] <= 58",
                              "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                              ,0x908,"void tinyexr::hufBuildEncTable(long long *, int *, int *)");
              }
              uVar46 = *(uint *)((long)__s + lVar24 * 4);
              if (uVar46 == (uint)uVar53) break;
              lVar24 = (long)(int)uVar46;
              lVar55 = hcode[lVar24];
              hcode[lVar24] = lVar55 + 1;
              uVar53 = (ulong)uVar46;
            }
            bVar57 = 2 < (long)puVar17;
            puVar17 = puVar56;
          } while (bVar57);
        }
        puVar17 = (ushort *)((long)local_128 + 1);
        hufCanonicalCodeTable(hcode);
        memcpy(pvVar21,hcode,0x80008);
        operator_delete(hcode);
        operator_delete(pplVar31);
        operator_delete(__s);
        uVar53 = local_150;
        pbVar16 = local_180;
        pbVar14 = local_180 + 0x18;
        pbVar18 = pbVar14;
        if ((int)puVar17 < (int)local_c0) {
          uVar51 = 0;
          iVar43 = 0;
        }
        else {
          uVar51 = 0;
          uVar33 = local_c0;
          iVar12 = 0;
          do {
            iVar13 = (int)uVar33;
            lVar24 = (long)iVar13;
            uVar33 = *(ulong *)((long)pvVar21 + lVar24 * 8) & 0x3f;
            if (uVar33 == 0) {
              uVar46 = 1;
              if (iVar13 <= (int)local_190) {
                uVar26 = 1;
                while (uVar46 = uVar26, (*(byte *)((long)pvVar21 + lVar24 * 8 + 8) & 0x3f) == 0) {
                  lVar24 = lVar24 + 1;
                  uVar46 = uVar26 + 1;
                  if (((long)puVar17 <= lVar24) ||
                     (bVar57 = 0x103 < uVar26, uVar26 = uVar46, bVar57)) break;
                }
                iVar13 = (int)lVar24;
              }
              if (uVar46 < 2) goto LAB_0022fe11;
              if (uVar46 < 6) {
                uVar51 = uVar51 << 6 | (ulong)(uVar46 + 0x39);
                iVar43 = iVar12 + 6;
                if (iVar12 < 2) goto LAB_0022fe4e;
                iVar12 = iVar12 + 0xe;
                do {
                  iVar43 = iVar43 + -8;
                  *pbVar18 = (byte)((long)uVar51 >> ((byte)iVar43 & 0x3f));
                  pbVar18 = pbVar18 + 1;
                  iVar12 = iVar12 + -8;
                } while (0xf < iVar12);
                goto LAB_0022fe47;
              }
              iVar36 = iVar12 + 6;
              uVar33 = uVar51 << 6 | 0x3f;
              if (1 < iVar12) {
                iVar12 = iVar12 + 0xe;
                do {
                  iVar43 = iVar12;
                  iVar36 = iVar36 + -8;
                  *pbVar18 = (byte)((long)uVar33 >> ((byte)iVar36 & 0x3f));
                  pbVar18 = pbVar18 + 1;
                  iVar12 = iVar43 + -8;
                } while (0xf < iVar12);
                iVar36 = iVar43 + -0x10;
              }
              uVar51 = uVar33 << 8 | (ulong)(uVar46 - 6);
              iVar43 = iVar36 + 8;
              if (-1 < iVar36) {
                iVar12 = iVar36 + 0x10;
                do {
                  iVar36 = iVar12;
                  iVar43 = iVar43 + -8;
                  *pbVar18 = (byte)((long)uVar51 >> ((byte)iVar43 & 0x3f));
                  pbVar18 = pbVar18 + 1;
                  iVar12 = iVar36 + -8;
                } while (0xf < iVar12);
                iVar43 = iVar36 + -0x10;
              }
            }
            else {
LAB_0022fe11:
              uVar51 = uVar33 | uVar51 << 6;
              iVar43 = iVar12 + 6;
              if (1 < iVar12) {
                iVar12 = iVar12 + 0xe;
                do {
                  iVar43 = iVar43 + -8;
                  *pbVar18 = (byte)((long)uVar51 >> ((byte)iVar43 & 0x3f));
                  pbVar18 = pbVar18 + 1;
                  iVar12 = iVar12 + -8;
                } while (0xf < iVar12);
LAB_0022fe47:
                iVar43 = iVar12 + -8;
              }
            }
LAB_0022fe4e:
            uVar33 = (ulong)(iVar13 + 1);
            iVar12 = iVar43;
          } while (iVar13 <= (int)local_190);
        }
        if (0 < iVar43) {
          *pbVar18 = (byte)(uVar51 << (8U - (char)iVar43 & 0x3f));
          pbVar18 = pbVar18 + 1;
        }
        uVar11 = *local_160;
        pbVar40 = pbVar18;
        if ((int)(uint)local_f0 < 2) {
          uVar33 = 0;
          iVar12 = 0;
          iVar13 = 0;
        }
        else {
          iVar13 = 0;
          uVar51 = 1;
          iVar12 = 0;
          uVar33 = 0;
          do {
            if (iVar13 < 0xff && uVar11 == local_160[uVar51]) {
              iVar43 = iVar13 + 1;
            }
            else {
              lVar24 = *(long *)((long)pvVar21 + (ulong)uVar11 * 8);
              lVar55 = *local_158;
              uVar52 = (uint)lVar24;
              uVar46 = uVar52 & 0x3f;
              uVar22 = (uint)lVar55;
              uVar26 = uVar22 & 0x3f;
              uVar39 = lVar24 >> 6;
              if ((long)((ulong)uVar46 + (ulong)uVar26 + 8) < (long)((ulong)uVar46 * (long)iVar13))
              {
                uVar39 = uVar33 << (sbyte)uVar46 | uVar39;
                iVar12 = (uVar52 & 0x3f) + iVar12;
                iVar36 = iVar12;
                iVar43 = iVar12;
                if (7 < iVar12) {
                  do {
                    *pbVar40 = (byte)((long)uVar39 >> ((byte)(iVar36 + -8) & 0x3f));
                    pbVar40 = pbVar40 + 1;
                    iVar43 = iVar12 + -8;
                    bVar57 = 0xf < iVar12;
                    iVar12 = iVar43;
                    iVar36 = iVar36 + -8;
                  } while (bVar57);
                }
                iVar43 = (uVar22 & 0x3f) + iVar43;
                uVar33 = uVar39 << (sbyte)uVar26 | lVar55 >> 6;
                iVar12 = iVar43;
                iVar36 = iVar43;
                if (7 < iVar43) {
                  do {
                    *pbVar40 = (byte)((long)uVar33 >> ((byte)(iVar12 + -8) & 0x3f));
                    pbVar40 = pbVar40 + 1;
                    iVar36 = iVar43 + -8;
                    bVar57 = 0xf < iVar43;
                    iVar43 = iVar36;
                    iVar12 = iVar12 + -8;
                  } while (bVar57);
                }
                iVar12 = iVar36 + 8;
                uVar33 = uVar33 << 8 | (long)iVar13;
                iVar43 = 0;
                if (-1 < iVar36) {
                  iVar13 = iVar36 + 0x10;
                  do {
                    iVar43 = iVar13;
                    iVar12 = iVar12 + -8;
                    *pbVar40 = (byte)((long)uVar33 >> ((byte)iVar12 & 0x3f));
                    pbVar40 = pbVar40 + 1;
                    iVar13 = iVar43 + -8;
                  } while (0xf < iVar13);
                  iVar12 = iVar43 + -0x10;
                  iVar43 = 0;
                }
              }
              else {
                iVar43 = 0;
                if (-1 < iVar13) {
                  do {
                    iVar12 = iVar12 + (uVar52 & 0x3f);
                    uVar33 = uVar33 << (sbyte)uVar46 | uVar39;
                    iVar42 = iVar12;
                    iVar36 = iVar12;
                    if (7 < iVar12) {
                      do {
                        *pbVar40 = (byte)((long)uVar33 >> ((byte)(iVar36 + -8) & 0x3f));
                        pbVar40 = pbVar40 + 1;
                        iVar12 = iVar42 + -8;
                        bVar57 = 0xf < iVar42;
                        iVar42 = iVar12;
                        iVar36 = iVar36 + -8;
                      } while (bVar57);
                    }
                    bVar57 = 0 < iVar13;
                    iVar13 = iVar13 + -1;
                  } while (bVar57);
                }
              }
            }
            iVar13 = iVar43;
            uVar11 = local_160[uVar51];
            uVar51 = uVar51 + 1;
          } while (uVar51 != ((uint)local_f0 & 0x7fffffff));
        }
        lVar24 = *(long *)((long)pvVar21 + (ulong)uVar11 * 8);
        lVar55 = *local_158;
        uVar22 = (uint)lVar24;
        uVar46 = uVar22 & 0x3f;
        uVar52 = (uint)lVar55;
        uVar26 = uVar52 & 0x3f;
        uVar51 = lVar24 >> 6;
        if ((long)((ulong)uVar46 + (ulong)uVar26 + 8) < (long)((ulong)uVar46 * (long)iVar13)) {
          uVar51 = uVar33 << (sbyte)uVar46 | uVar51;
          iVar12 = (uVar22 & 0x3f) + iVar12;
          iVar36 = iVar12;
          iVar43 = iVar12;
          if (7 < iVar12) {
            do {
              *pbVar40 = (byte)((long)uVar51 >> ((byte)(iVar36 + -8) & 0x3f));
              pbVar40 = pbVar40 + 1;
              iVar43 = iVar12 + -8;
              bVar57 = 0xf < iVar12;
              iVar12 = iVar43;
              iVar36 = iVar36 + -8;
            } while (bVar57);
          }
          iVar43 = (uVar52 & 0x3f) + iVar43;
          uVar33 = uVar51 << (sbyte)uVar26 | lVar55 >> 6;
          iVar12 = iVar43;
          iVar36 = iVar43;
          if (7 < iVar43) {
            do {
              *pbVar40 = (byte)((long)uVar33 >> ((byte)(iVar12 + -8) & 0x3f));
              pbVar40 = pbVar40 + 1;
              iVar36 = iVar43 + -8;
              bVar57 = 0xf < iVar43;
              iVar43 = iVar36;
              iVar12 = iVar12 + -8;
            } while (bVar57);
          }
          iVar12 = iVar36 + 8;
          uVar33 = uVar33 << 8 | (long)iVar13;
          if (-1 < iVar36) {
            iVar13 = iVar36 + 0x10;
            do {
              iVar43 = iVar13;
              iVar12 = iVar12 + -8;
              *pbVar40 = (byte)((long)uVar33 >> ((byte)iVar12 & 0x3f));
              pbVar40 = pbVar40 + 1;
              iVar13 = iVar43 + -8;
            } while (0xf < iVar13);
            iVar12 = iVar43 + -0x10;
          }
        }
        else if (-1 < iVar13) {
          do {
            iVar36 = iVar12 + (uVar22 & 0x3f);
            uVar33 = uVar33 << (sbyte)uVar46 | uVar51;
            iVar43 = iVar36;
            iVar12 = iVar36;
            if (7 < iVar36) {
              do {
                *pbVar40 = (byte)((long)uVar33 >> ((byte)(iVar43 + -8) & 0x3f));
                pbVar40 = pbVar40 + 1;
                iVar12 = iVar36 + -8;
                bVar57 = 0xf < iVar36;
                iVar36 = iVar12;
                iVar43 = iVar43 + -8;
              } while (bVar57);
            }
            bVar57 = 0 < iVar13;
            iVar13 = iVar13 + -1;
          } while (bVar57);
        }
        if (iVar12 != 0) {
          *pbVar40 = (byte)(uVar33 << (8U - (char)iVar12 & 0x3f));
        }
        iVar36 = (int)pbVar40 - (int)pbVar18;
        lVar24 = (long)pbVar18 - (long)pbVar14;
        iVar43 = iVar12 + iVar36 * 8 + 7;
        iVar13 = iVar12 + iVar36 * 8 + 0xe;
        if (-1 < iVar43) {
          iVar13 = iVar43;
        }
        local_180[4] = (byte)local_c0;
        local_180[5] = (byte)(local_c0 >> 8);
        local_180[6] = (byte)(local_c0 >> 0x10);
        local_180[7] = (byte)(local_c0 >> 0x18);
        local_180[8] = (byte)puVar17;
        local_180[9] = (byte)((ulong)puVar17 >> 8);
        local_180[10] = (byte)((ulong)puVar17 >> 0x10);
        local_180[0xb] = (byte)((ulong)puVar17 >> 0x18);
        local_180[0xc] = (byte)lVar24;
        local_180[0xd] = (byte)((ulong)lVar24 >> 8);
        local_180[0xe] = (byte)((ulong)lVar24 >> 0x10);
        local_180[0xf] = (byte)((ulong)lVar24 >> 0x18);
        iVar12 = iVar12 + iVar36 * 8;
        local_180[0x10] = (byte)iVar12;
        local_180[0x11] = (byte)((uint)iVar12 >> 8);
        local_180[0x12] = (byte)((uint)iVar12 >> 0x10);
        local_180[0x13] = (byte)((uint)iVar12 >> 0x18);
        iVar12 = (int)local_b8;
        iVar13 = ((iVar13 >> 3) + (int)pbVar18) - iVar12;
        local_180[0x14] = 0;
        local_180[0x15] = 0;
        local_180[0x16] = 0;
        local_180[0x17] = 0;
        local_128 = puVar17;
        operator_delete(pvVar21);
      }
      pvVar21 = local_130;
      *(int *)pbVar16 = iVar13;
      uVar33 = (ulong)(uint)((iVar12 - (int)local_80) + iVar13);
      if (uVar53 <= uVar33) {
        memcpy(local_80,local_88,uVar53);
        uVar33 = uVar53 & 0xffffffff;
      }
      operator_delete(pvVar21);
      pbVar16 = local_100;
      if (local_118.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((ushort *)
          local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (ushort *)0x0) {
        operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(pbVar16);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_d0,*(undefined8 *)(local_d0 + 8),
                 local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (byte *)((long)(unsigned_short **)
                                local_a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar33));
      local_118.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_002301fc:
      if (local_118.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00230206;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
LAB_00230399:
  __assert_fail("outSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                ,0x650,
                "void tinyexr::CompressRle(unsigned char *, tinyexr::tinyexr_uint64 &, const unsigned char *, unsigned long)"
               );
LAB_0022eee1:
  puVar17 = puVar28 + -1;
LAB_0022eeaa:
  *(char *)&pPVar50->start = (char)puVar56 - (char)puVar17;
  pPVar50 = (pointer)((long)&pPVar50->start + 1);
  if (puVar56 < puVar17) {
    lVar24 = (long)puVar17 - (long)puVar56;
    do {
      uVar11 = *puVar56;
      puVar56 = (ushort *)((long)puVar56 + 1);
      *(byte *)&pPVar50->start = (byte)uVar11;
      pPVar50 = (pointer)((long)&pPVar50->start + 1);
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
LAB_0022eed3:
  if (puVar19 <= puVar56) goto LAB_0022f2df;
  goto LAB_0022ede7;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}